

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O0

LispPTR CHAR_closefile(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  int *piVar3;
  bool bVar4;
  uint local_28;
  uint local_24;
  int rval;
  int fd;
  LispPTR *args_local;
  
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);
  if ((*args & 0xfff0000) == 0xe0000) {
    local_24 = *args & 0xffff;
  }
  else {
    if ((*args & 0xfff0000) == 0xf0000) {
      local_28 = *args | 0xffff0000;
    }
    else {
      pLVar2 = NativeAligned4FromLAddr(*args);
      local_28 = *pLVar2;
    }
    local_24 = local_28;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    alarm(TIMEOUT_TIME);
    do {
      piVar3 = __errno_location();
      *piVar3 = 0;
      iVar1 = close(local_24);
      bVar4 = false;
      if (iVar1 == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    alarm(0);
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 == 1) {
        args_local._4_4_ = 0x4c;
      }
      else {
        piVar3 = __errno_location();
        err_mess("close",*piVar3);
        piVar3 = __errno_location();
        *Lisp_errno = *piVar3;
        args_local._4_4_ = 0;
      }
    }
    else {
      args_local._4_4_ = 0x4c;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR CHAR_closefile(LispPTR *args)
/* args[0]            fd      */
/* args[1]            errno   */
{
#ifndef DOS
  int fd; /* file descriptor */
  int rval;
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);
  fd = LispNumToCInt(args[0]);
  ERRSETJMP(NIL);
  TIMEOUT(rval = close(fd));
  if (rval == -1) {
    /** This if is a patch for an apparent problem **/
    /** in SunOS 4 that causes a close on /dev/ttya **/
    /** to error with 'not owner' **/
    if (errno == 1) {
      DBPRINT(("Got errno 1 on a CLOSE!"));
      return (ATOM_T);
    }
    DBPRINT(("Closing char device descriptor #%d.\n", fd));
    err_mess("close", errno);
    *Lisp_errno = errno;
    return (NIL);
  }
  return (ATOM_T);
#endif /* DOS */
}